

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int64_t av1_block_error_lp_c(int16_t *coeff,int16_t *dqcoeff,intptr_t block_size)

{
  int diff;
  int i;
  int64_t error;
  intptr_t block_size_local;
  int16_t *dqcoeff_local;
  int16_t *coeff_local;
  
  error = 0;
  for (i = 0; i < block_size; i = i + 1) {
    error = ((int)coeff[i] - (int)dqcoeff[i]) * ((int)coeff[i] - (int)dqcoeff[i]) + error;
  }
  return error;
}

Assistant:

int64_t av1_block_error_lp_c(const int16_t *coeff, const int16_t *dqcoeff,
                             intptr_t block_size) {
  int64_t error = 0;

  for (int i = 0; i < block_size; i++) {
    const int diff = coeff[i] - dqcoeff[i];
    error += diff * diff;
  }

  return error;
}